

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

bool __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
::overlaps<float,false,std::allocator<unsigned_long>>
          (BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
           *this,View<float,_false,_std::allocator<unsigned_long>_> *v)

{
  View<float,_true,_std::allocator<unsigned_long>_> *this_00;
  pointer pfVar1;
  pointer pfVar2;
  bool bVar3;
  reference pfVar4;
  reference pfVar5;
  void *vDataPointer_;
  void *dataPointer_;
  
  this_00 = *(View<float,_true,_std::allocator<unsigned_long>_> **)this;
  View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  pfVar1 = this_00->data_;
  if ((pfVar1 == (pointer)0x0) || (pfVar2 = v->data_, pfVar2 == (pointer)0x0)) {
    bVar3 = false;
  }
  else {
    pfVar4 = View<float,_true,_std::allocator<unsigned_long>_>::operator()
                       (this_00,(this_00->geometry_).size_ - 1);
    pfVar5 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((pfVar2 < pfVar1) || (pfVar4 < pfVar2)) {
      if (pfVar1 < pfVar2) {
        return false;
      }
      if (pfVar5 < pfVar1) {
        return false;
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e_.overlaps(v); }